

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

pair<unsigned_int,_unsigned_int> __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::initial_bucketing(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                    *this,uint k)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *this_00;
  byte *pbVar5;
  reference pvVar6;
  size_type sVar7;
  ulong uVar8;
  reference puVar9;
  uint local_c4;
  uint i_1;
  unsigned_long s_1;
  iterator buk_it;
  unsigned_long last_kmer;
  unsigned_long s;
  ulong uStack_98;
  uint i;
  unsigned_long kmer;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  str_it;
  unsigned_long kmer_mask;
  uint opt_k;
  uint l;
  uint sigma;
  undefined1 local_68 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> alphabet_mapping;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> alphabet_hist;
  size_t min_local_size;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *psStack_18;
  uint k_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *this_local;
  
  min_local_size._4_4_ = k;
  psStack_18 = this;
  alphabet_hist.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)mxx::partition::block_decomposition_buffered<unsigned_long>::local_size
                          (&this->part,this->p + -1);
  alphabet_mapping.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->input_end)._M_current;
  alphabet_histogram<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(this->input_begin)._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )alphabet_mapping.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,&this->comm);
  alphabet_mapping_tbl<unsigned_long>
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_68,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  opt_k = alphabet_unique_chars<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  kmer_mask._4_4_ = alphabet_bits_per_char(opt_k);
  kmer_mask._0_4_ = alphabet_chars_per_word<unsigned_long>(kmer_mask._4_4_);
  if ((min_local_size._4_4_ == 0) || ((uint)kmer_mask < min_local_size._4_4_)) {
    if ((uint)kmer_mask < min_local_size._4_4_) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"[WARNING] given `k` value of ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,min_local_size._4_4_);
      poVar4 = std::operator<<(poVar4," is too large, setting k=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)kmer_mask);
      poVar4 = std::operator<<(poVar4," instead.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    min_local_size._4_4_ = (uint)kmer_mask;
  }
  if (alphabet_hist.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage <= (pointer)(ulong)min_local_size._4_4_) {
    min_local_size._4_4_ =
         (uint)alphabet_hist.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar2 = mxx::comm::size(&this->comm);
    if ((iVar2 == 1) && (1 < min_local_size._4_4_)) {
      min_local_size._4_4_ = min_local_size._4_4_ - 1;
    }
  }
  iVar2 = mxx::comm::rank(&this->comm);
  if (iVar2 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Detecting sigma=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,opt_k);
    poVar4 = std::operator<<(poVar4," => l=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,kmer_mask._4_4_);
    poVar4 = std::operator<<(poVar4,", k=");
    this_00 = (void *)std::ostream::operator<<(poVar4,min_local_size._4_4_);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  str_it._M_current =
       (char *)((1L << ((char)kmer_mask._4_4_ * (char)min_local_size._4_4_ & 0x3fU)) + -1);
  if (str_it._M_current == (char *)0x0) {
    str_it._M_current = (char *)0xffffffffffffffff;
  }
  kmer = (unsigned_long)(this->input_begin)._M_current;
  uStack_98 = 0;
  for (s._4_4_ = 0; s._4_4_ < min_local_size._4_4_ - 1; s._4_4_ = s._4_4_ + 1) {
    uStack_98 = uStack_98 << ((byte)kmer_mask._4_4_ & 0x3f);
    pbVar5 = (byte *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&kmer);
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_68,
                        (ulong)*pbVar5);
    uStack_98 = *pvVar6 | uStack_98;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&kmer);
  }
  buk_it._M_current =
       (unsigned_long *)mxx::left_shift<unsigned_long>(&stack0xffffffffffffff68,&this->comm);
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->local_B);
  if (sVar7 != this->local_size) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->local_B,this->local_size);
  }
  s_1 = (unsigned_long)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->local_B);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&kmer,&this->input_end), bVar1) {
    uStack_98 = uStack_98 << ((byte)kmer_mask._4_4_ & 0x3f);
    pbVar5 = (byte *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&kmer);
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_68,
                        (ulong)*pbVar5);
    uVar8 = (ulong)str_it._M_current & (*pvVar6 | uStack_98);
    uStack_98 = uVar8;
    puVar9 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&s_1);
    *puVar9 = uVar8;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&kmer);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&s_1);
  }
  iVar2 = mxx::comm::rank(&this->comm);
  iVar3 = mxx::comm::size(&this->comm);
  if (iVar3 + -1 <= iVar2) {
    buk_it._M_current = (unsigned_long *)0x0;
  }
  for (local_c4 = 0; local_c4 < min_local_size._4_4_ - 1; local_c4 = local_c4 + 1) {
    uVar8 = (ulong)str_it._M_current &
            ((ulong)buk_it._M_current >>
             ((byte)kmer_mask._4_4_ * (((char)min_local_size._4_4_ - (char)local_c4) + -2) & 0x3f) |
            uStack_98 << ((byte)kmer_mask._4_4_ & 0x3f));
    uStack_98 = uVar8;
    puVar9 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&s_1);
    *puVar9 = uVar8;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&s_1);
  }
  this_local = (suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                *)std::make_pair<unsigned_int&,unsigned_int&>
                            ((uint *)((long)&min_local_size + 4),(uint *)((long)&kmer_mask + 4));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  return (pair<unsigned_int,_unsigned_int>)this_local;
}

Assistant:

std::pair<unsigned int, unsigned int> initial_bucketing(unsigned int k = 0)
{
    std::size_t min_local_size = part.local_size(p-1);

    // get global alphabet histogram
    std::vector<index_t> alphabet_hist = alphabet_histogram<InputIterator, index_t>(input_begin, input_end, comm);
    // get mapping table and alphabet sizes
    std::vector<uint16_t> alphabet_mapping = alphabet_mapping_tbl(alphabet_hist);
    unsigned int sigma = alphabet_unique_chars(alphabet_hist);
    // bits per character: set l=ceil(log(sigma))
    unsigned int l = alphabet_bits_per_char(sigma);
    // number of characters per word => the `k` in `k-mer`
    unsigned int opt_k = alphabet_chars_per_word<index_t>(l);
    if (k == 0 || k > opt_k) {
        if (k > opt_k)
            std::cerr << "[WARNING] given `k` value of " << k << " is too large, setting k=" << opt_k << " instead." << std::endl;
        k = opt_k;
    }
    // if the input is too small for `k`, choose a smaller `k`
    if (k >= min_local_size) {
        k = min_local_size;
        if (comm.size() == 1 && k > 1)
            k--;
    }

    if (comm.rank() == 0)
        INFO("Detecting sigma=" << sigma << " => l=" << l << ", k=" << k);

    // get k-mer mask
    index_t kmer_mask = ((static_cast<index_t>(1) << (l*k)) - static_cast<index_t>(1));
    if (kmer_mask == 0)
        kmer_mask = ~static_cast<index_t>(0);

    // sliding window k-mer (for prototype only using ASCII alphabet)

    // fill first k-mer (until k-1 positions) and send to left processor
    // filling k-mer with first character = MSBs for lexicographical ordering
    InputIterator str_it = input_begin;
    index_t kmer = 0;
    for (unsigned int i = 0; i < k-1; ++i) {
        kmer <<= l;
        index_t s = (unsigned char)(*str_it);
        kmer |= alphabet_mapping[s];
        ++str_it;
    }

    // send first kmer to left processor
    // TODO: use async left shift!
    index_t last_kmer = mxx::left_shift(kmer, comm);

    // init output
    if (local_B.size() != local_size)
        local_B.resize(local_size);
    auto buk_it = local_B.begin();
    // continue to create all k-mers and add into histogram count
    while (str_it != input_end) {
        // get next kmer
        kmer <<= l;
        index_t s = (unsigned char)(*str_it);
        kmer |= alphabet_mapping[s];
        kmer &= kmer_mask;
        // add to bucket number array
        *buk_it = kmer;
        // increase iterators
        ++str_it;
        ++buk_it;
    }

    // finish the receive to get the last k-1 k-kmers with string data from the
    // processor to the right
    // if not last processor
    if (comm.rank() < comm.size()-1) {
        // TODO: use mxx::future to handle this async left shift
        // wait for the async receive to finish
        //MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
        //req.wait();
    } else {
        // in this case the last k-mers contains shifting `$` signs
        // we assume this to be the `\0` value
        last_kmer = 0;
    }


    // construct last (k-1) k-mers
    for (unsigned int i = 0; i < k-1; ++i) {
        kmer <<= l;
        kmer |= (last_kmer >> (l*(k-i-2)));
        kmer &= kmer_mask;

        // add to bucket number array
        *buk_it = kmer;
        ++buk_it;
    }

    // return the number of characters which are part of each bucket number
    // (i.e., k-mer)
    return std::make_pair(k, l);
}